

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserManager.cpp
# Opt level: O2

void __thiscall phpconvert::ParserManager::parse(ParserManager *this,AppParams *params)

{
  BaseParser *pBVar1;
  string local_60;
  string local_40;
  
  pBVar1 = this->parser;
  std::__cxx11::string::string((string *)&local_40,(string *)params);
  BaseParser::setSourceDir(pBVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  BaseParser::setRecursive(this->parser,params->recursive);
  pBVar1 = this->parser;
  std::__cxx11::string::string((string *)&local_60,(string *)&params->outputPath);
  BaseParser::setOutputDir(pBVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  (*this->parser->_vptr_BaseParser[2])();
  return;
}

Assistant:

void ParserManager::parse(AppParams *params) {
        getParser()->setSourceDir(params->path);
        getParser()->setRecursive(params->recursive);
        getParser()->setOutputDir(params->outputPath);
        getParser()->parse();
    }